

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seven-pairs-recognizer.cpp
# Opt level: O2

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::SevenPairsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,SevenPairsRecognizer *this)

{
  _Rb_tree_header *p_Var1;
  initializer_list<mahjong::Pattern> __l;
  allocator_type local_e;
  less<mahjong::Pattern> local_d;
  Pattern local_c;
  
  if ((long)(this->front_tiles_of_pair).
            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->front_tiles_of_pair).
            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
            super__Vector_impl_data._M_start == 0x1c) {
    local_c = SevenPairs;
    __l._M_len = 1;
    __l._M_array = &local_c;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
              (__return_storage_ptr__,__l,&local_d,&local_e);
  }
  else {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

set<Pattern> SevenPairsRecognizer::recognize()
{
	if (7 == front_tiles_of_pair.size())
	{
		return { Pattern::SevenPairs };
	}

	return {};
}